

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_belme_gfe
          (REF_DBL *metric,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  double dVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  REF_DBL *pRVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  REF_DBL *pRVar11;
  REF_STATUS RVar12;
  int iVar13;
  ulong uVar14;
  REF_DBL state [5];
  REF_DBL node_flux [5];
  REF_DBL *local_100;
  REF_DBL *local_f8;
  REF_DBL *local_e8;
  REF_DBL *local_e0;
  REF_DBL *local_d8;
  long local_d0;
  REF_DBL *local_c8;
  REF_DBL local_a8 [4];
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL local_58 [5];
  
  pRVar2 = ref_grid->node;
  iVar13 = pRVar2->max;
  uVar14 = (ulong)iVar13;
  if ((long)uVar14 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa87,
           "ref_metric_belme_gfe","malloc lam of REF_DBL negative");
    uVar14 = 1;
  }
  else {
    local_f8 = (REF_DBL *)malloc(uVar14 * 8);
    if (local_f8 == (REF_DBL *)0x0) {
      local_f8 = (REF_DBL *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa87,"ref_metric_belme_gfe","malloc lam of REF_DBL NULL");
      uVar14 = 2;
      bVar4 = false;
    }
    else {
      bVar4 = true;
      if (iVar13 != 0) {
        memset(local_f8,0,uVar14 * 8);
      }
    }
  }
  RVar12 = (REF_STATUS)uVar14;
  if (bVar4) {
    uVar14 = uVar14 & 0xffffffff;
    uVar5 = pRVar2->max;
    if ((int)uVar5 < 0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa88,"ref_metric_belme_gfe","malloc grad_lam of REF_DBL negative");
      uVar14 = 1;
    }
    else {
      local_100 = (REF_DBL *)malloc((ulong)uVar5 * 0x18);
      if (local_100 == (REF_DBL *)0x0) {
        local_100 = (REF_DBL *)0x0;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa88,"ref_metric_belme_gfe","malloc grad_lam of REF_DBL NULL");
        uVar14 = 2;
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if ((ulong)uVar5 != 0) {
          uVar6 = 1;
          if (1 < (int)(uVar5 * 3)) {
            uVar6 = (ulong)(uVar5 * 3);
          }
          memset(local_100,0,uVar6 << 3);
        }
      }
    }
    RVar12 = (REF_STATUS)uVar14;
    if (bVar4) {
      iVar13 = pRVar2->max;
      if ((long)iVar13 < 0) {
        bVar4 = false;
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa89,"ref_metric_belme_gfe","malloc flux of REF_DBL negative");
        uVar14 = 1;
      }
      else {
        __size = (long)iVar13 * 8;
        local_e0 = (REF_DBL *)malloc(__size);
        if (local_e0 == (REF_DBL *)0x0) {
          local_e0 = (REF_DBL *)0x0;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa89,"ref_metric_belme_gfe","malloc flux of REF_DBL NULL");
          uVar14 = 2;
          bVar4 = false;
        }
        else {
          bVar4 = true;
          if (iVar13 != 0) {
            memset(local_e0,0,__size);
          }
        }
      }
      RVar12 = (REF_STATUS)uVar14;
      if (bVar4) {
        uVar5 = pRVar2->max;
        if ((int)uVar5 < 0) {
          bVar4 = false;
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa8a,"ref_metric_belme_gfe","malloc hess_flux of REF_DBL negative");
          uVar14 = 1;
        }
        else {
          local_e8 = (REF_DBL *)malloc((ulong)uVar5 * 0x30);
          if (local_e8 == (REF_DBL *)0x0) {
            local_e8 = (REF_DBL *)0x0;
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa8a,"ref_metric_belme_gfe","malloc hess_flux of REF_DBL NULL");
            uVar14 = 2;
            bVar4 = false;
          }
          else {
            bVar4 = true;
            if ((ulong)uVar5 != 0) {
              uVar6 = 1;
              if (1 < (int)(uVar5 * 6)) {
                uVar6 = (ulong)(uVar5 * 6);
              }
              memset(local_e8,0,uVar6 << 3);
            }
          }
        }
        RVar12 = (REF_STATUS)uVar14;
        if (bVar4) {
          local_c8 = prim_dual + ldim / 2;
          local_d0 = 0;
          do {
            iVar13 = pRVar2->max;
            if (0 < (long)iVar13) {
              pRVar3 = pRVar2->global;
              lVar9 = 0;
              pRVar7 = local_c8;
              do {
                if (-1 < pRVar3[lVar9]) {
                  local_f8[lVar9] = *pRVar7;
                }
                lVar9 = lVar9 + 1;
                pRVar7 = pRVar7 + ldim;
              } while (iVar13 != lVar9);
            }
            uVar5 = ref_recon_gradient(ref_grid,local_f8,local_100,reconstruction);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                     ,0xa93,"ref_metric_belme_gfe",(ulong)uVar5,"grad_lam");
              uVar14 = (ulong)uVar5;
            }
            if (uVar5 != 0) {
              return (REF_STATUS)uVar14;
            }
            lVar9 = 0;
            do {
              if (0 < pRVar2->max) {
                iVar13 = 0;
                lVar8 = 0;
                do {
                  if (-1 < pRVar2->global[lVar8]) {
                    local_a8[0] = 0.0;
                    local_a8[1] = 0.0;
                    local_a8[2] = 0.0;
                    local_a8[lVar9] = 1.0;
                    local_88 = prim_dual[iVar13];
                    RStack_80 = (prim_dual + iVar13)[1];
                    local_78 = prim_dual[(long)iVar13 + 2];
                    RStack_70 = (prim_dual + (long)iVar13 + 2)[1];
                    local_68 = prim_dual[(long)iVar13 + 4];
                    uVar5 = ref_phys_euler(&local_88,local_a8,local_58);
                    if (uVar5 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xa9d,"ref_metric_belme_gfe",(ulong)uVar5,"euler");
                      return uVar5;
                    }
                    local_e0[lVar8] = local_58[local_d0];
                  }
                  lVar8 = lVar8 + 1;
                  iVar13 = iVar13 + ldim;
                } while (lVar8 < pRVar2->max);
              }
              uVar5 = ref_recon_hessian(ref_grid,local_e0,local_e8,reconstruction);
              if (uVar5 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                       ,0xaa0,"ref_metric_belme_gfe",(ulong)uVar5,"hess");
                uVar14 = (ulong)uVar5;
              }
              if (uVar5 != 0) {
                return (REF_STATUS)uVar14;
              }
              iVar13 = pRVar2->max;
              if (0 < (long)iVar13) {
                pRVar3 = pRVar2->global;
                lVar8 = 0;
                pRVar7 = local_e8;
                pRVar11 = metric;
                do {
                  if (-1 < pRVar3[lVar8]) {
                    dVar1 = local_100[lVar8 * 3 + lVar9];
                    if (dVar1 <= -dVar1) {
                      dVar1 = -dVar1;
                    }
                    lVar10 = 0;
                    do {
                      pRVar11[lVar10] = pRVar7[lVar10] * dVar1 + pRVar11[lVar10];
                      lVar10 = lVar10 + 1;
                    } while (lVar10 != 6);
                  }
                  lVar8 = lVar8 + 1;
                  pRVar11 = pRVar11 + 6;
                  pRVar7 = pRVar7 + 6;
                } while (lVar8 != iVar13);
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_d0 = local_d0 + 1;
            local_c8 = local_c8 + 1;
          } while (local_d0 != 5);
          if (0 < pRVar2->max) {
            lVar9 = 0;
            local_d8 = metric;
            do {
              if (-1 < pRVar2->global[lVar9]) {
                uVar5 = ref_matrix_healthy_m(local_d8);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                         ,0xaab,"ref_metric_belme_gfe",(ulong)uVar5,"euler-opt-goal");
                  uVar14 = (ulong)uVar5;
                }
                if (uVar5 != 0) {
                  return (REF_STATUS)uVar14;
                }
              }
              lVar9 = lVar9 + 1;
              local_d8 = local_d8 + 6;
            } while (lVar9 < pRVar2->max);
          }
          if (local_e8 != (REF_DBL *)0x0) {
            free(local_e8);
          }
          if (local_e0 != (REF_DBL *)0x0) {
            free(local_e0);
          }
          if (local_100 != (REF_DBL *)0x0) {
            free(local_100);
          }
          RVar12 = 0;
          if (local_f8 != (REF_DBL *)0x0) {
            free(local_f8);
          }
        }
      }
    }
  }
  return RVar12;
}

Assistant:

REF_FCN REF_STATUS ref_metric_belme_gfe(
    REF_DBL *metric, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, dir, node, i;
  REF_INT nequ;
  REF_DBL state[5], node_flux[5], direction[3];
  REF_DBL *lam, *grad_lam, *flux, *hess_flux;
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  nequ = ldim / 2;

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = prim_dual[var + 1 * nequ + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");
    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        direction[0] = 0.0;
        direction[1] = 0.0;
        direction[2] = 0.0;
        direction[dir] = 1.0;
        for (i = 0; i < 5; i++) {
          state[i] = prim_dual[i + 0 * nequ + ldim * node];
        }
        RSS(ref_phys_euler(state, direction, node_flux), "euler");
        flux[node] = node_flux[var];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++) {
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
        }
      }
    }
  }

  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_matrix_healthy_m(&(metric[6 * node])), "euler-opt-goal");
  }

  ref_free(hess_flux);
  ref_free(flux);
  ref_free(grad_lam);
  ref_free(lam);

  return REF_SUCCESS;
}